

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_read_file(mbedtls_mpi *X,int radix,FILE *fin)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *s_00;
  size_t sVar4;
  size_t sVar5;
  char cVar6;
  mbedtls_mpi_uint d;
  char s [2484];
  
  memset(s,0,0x9b4);
  pcVar2 = fgets(s,0x9b3,(FILE *)fin);
  if (pcVar2 == (char *)0x0) {
    iVar1 = -2;
  }
  else {
    sVar3 = strlen(s);
    if (sVar3 == 0x9b2) {
      iVar1 = -8;
    }
    else {
      sVar5 = sVar3 - 1;
      cVar6 = s[sVar3 - 1];
      if (cVar6 == '\n') {
        s[sVar3 - 1] = '\0';
        sVar4 = sVar3 - 2;
        cVar6 = s[sVar3 - 2];
        sVar3 = sVar5;
        sVar5 = sVar4;
      }
      if (cVar6 == '\r') {
        s[sVar5] = '\0';
        sVar3 = sVar5;
      }
      pcVar2 = s + sVar3;
      do {
        s_00 = pcVar2;
        pcVar2 = s_00 + -1;
        if (pcVar2 < s) break;
        iVar1 = mpi_get_digit(&d,radix,*pcVar2);
      } while (iVar1 == 0);
      iVar1 = mbedtls_mpi_read_string(X,radix,s_00);
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_mpi_read_file( mbedtls_mpi *X, int radix, FILE *fin )
{
    mbedtls_mpi_uint d;
    size_t slen;
    char *p;
    /*
     * Buffer should have space for (short) label and decimal formatted MPI,
     * newline characters and '\0'
     */
    char s[ MBEDTLS_MPI_RW_BUFFER_SIZE ];

    memset( s, 0, sizeof( s ) );
    if( fgets( s, sizeof( s ) - 1, fin ) == NULL )
        return( MBEDTLS_ERR_MPI_FILE_IO_ERROR );

    slen = strlen( s );
    if( slen == sizeof( s ) - 2 )
        return( MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL );

    if( s[slen - 1] == '\n' ) { slen--; s[slen] = '\0'; }
    if( s[slen - 1] == '\r' ) { slen--; s[slen] = '\0'; }

    p = s + slen;
    while( --p >= s )
        if( mpi_get_digit( &d, radix, *p ) != 0 )
            break;

    return( mbedtls_mpi_read_string( X, radix, p + 1 ) );
}